

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_pack_(void *inbuf,MPIABI_Fint *incount,MPIABI_Fint *datatype,void *outbuf,
                 MPIABI_Fint *outsize,int *position,MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  mpi_pack_();
  return;
}

Assistant:

void mpiabi_pack_(
  const void * inbuf,
  const MPIABI_Fint * incount,
  const MPIABI_Fint * datatype,
  void * outbuf,
  const MPIABI_Fint * outsize,
  int * position,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_pack_(
    inbuf,
    incount,
    datatype,
    outbuf,
    outsize,
    position,
    comm,
    ierror
  );
}